

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O3

MetaIterator __thiscall rtosc::Port::MetaContainer::find(MetaContainer *this,char *str)

{
  int iVar1;
  char *pcVar2;
  MetaIterator MVar3;
  MetaIterator __begin1;
  MetaIterator x;
  MetaIterator local_58;
  MetaIterator local_48;
  MetaIterator local_30;
  
  MVar3 = begin(this);
  local_58 = MVar3;
  MetaIterator::MetaIterator(&local_30,(char *)0x0);
  pcVar2 = MVar3.title;
  while (pcVar2 != local_30.title) {
    pcVar2 = local_58.title;
    local_48.title = local_58.title;
    local_48.value = local_58.value;
    iVar1 = strcmp(local_58.title,str);
    if (iVar1 == 0) goto LAB_0010651a;
    MetaIterator::operator++(&local_58);
    pcVar2 = local_58.title;
  }
  MetaIterator::MetaIterator(&local_48,(char *)0x0);
  pcVar2 = local_48.title;
LAB_0010651a:
  MVar3.value = local_48.value;
  MVar3.title = pcVar2;
  return MVar3;
}

Assistant:

Port::MetaIterator Port::MetaContainer::find(const char *str) const
{
    for(const auto x : *this)
        if(!strcmp(x.title, str))
            return x;
    return NULL;
}